

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O2

void ddClearFlag(DdNode *f)

{
  for (; (((ulong)f->next & 1) != 0 &&
         (f->next = (DdNode *)((ulong)f->next & 0xfffffffffffffffe), f->index != 0x7fffffff));
      f = (DdNode *)((ulong)(f->type).kids.E & 0xfffffffffffffffe)) {
    ddClearFlag((f->type).kids.T);
  }
  return;
}

Assistant:

static void
ddClearFlag(
  DdNode * f)
{
    if (!Cudd_IsComplement(f->next)) {
        return;
    }
    /* Clear visited flag. */
    f->next = Cudd_Regular(f->next);
    if (cuddIsConstant(f)) {
        return;
    }
    ddClearFlag(cuddT(f));
    ddClearFlag(Cudd_Regular(cuddE(f)));
    return;

}